

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.cpp
# Opt level: O2

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_> *this,TPZGeoMesh *destmesh,
          TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdIdx,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElIdx)

{
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoLinear>).
    super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>.super_TPZGeoEl = &PTR__TPZSavable_01738ed8;
  TPZGeoElRefPattern<pzgeom::TPZGeoLinear>::TPZGeoElRefPattern
            (&this->super_TPZGeoElRefPattern<pzgeom::TPZGeoLinear>,&PTR_PTR_01738460,destmesh,
             &copy->super_TPZGeoElRefPattern<pzgeom::TPZGeoLinear>,gl2lcNdIdx,gl2lcElIdx);
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoLinear>).
    super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>.super_TPZGeoEl = &PTR__TPZGeoElMapped_01738150;
  TPZFNMatrix<2,_double>::TPZFNMatrix(&this->fCornerCo,&copy->fCornerCo);
  return;
}

Assistant:

TPZGeoElMapped<TBase>::TPZGeoElMapped(TPZGeoMesh &destmesh, const TPZGeoElMapped<TBase> &copy, std::map<int64_t,int64_t> &gl2lcNdIdx,
                                      std::map<int64_t,int64_t> &gl2lcElIdx) : 
TPZRegisterClassId(&TPZGeoElMapped::ClassId),TBase(destmesh,copy,gl2lcNdIdx,gl2lcElIdx),
    fCornerCo(copy.fCornerCo)
{
    
}